

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatmain.c
# Opt level: O0

uint8 ecx_siigetbyte(ecx_contextt *context,uint16 slave,uint16 address)

{
  uint16 configadr_00;
  int iVar1;
  uint64 uVar2;
  uint8 local_2d;
  int local_2c;
  int iStack_28;
  uint8 retval;
  int cnt;
  int lp;
  uint16 mapb;
  uint16 mapw;
  uint64 edat;
  uint16 eadr;
  uint16 configadr;
  uint16 address_local;
  uint16 slave_local;
  ecx_contextt *context_local;
  
  local_2d = 0xff;
  if (slave != context->esislave) {
    memset(context->esimap,0,0x80);
    context->esislave = slave;
  }
  if (address < 0x1000) {
    if ((context->esimap[(ushort)((int)(uint)address >> 5)] & 1 << ((byte)address & 0x1f)) == 0) {
      configadr_00 = context->slavelist[slave].configadr;
      ecx_eeprom2master(context,slave);
      iVar1 = (int)(uint)address >> 1;
      uVar2 = ecx_readeepromFP(context,configadr_00,(uint16)iVar1,20000);
      if (context->slavelist[slave].eep_8byte == '\0') {
        lp = (int)uVar2;
        *(int *)(context->esibuf + (iVar1 << 1)) = lp;
        local_2c = 4;
      }
      else {
        *(uint64 *)(context->esibuf + (iVar1 << 1)) = uVar2;
        local_2c = 8;
      }
      cnt._2_2_ = (ushort)((int)(uint)address >> 5);
      cnt._0_2_ = (uint16)iVar1 * 2 + cnt._2_2_ * -0x20;
      for (iStack_28 = 0; iStack_28 < local_2c; iStack_28 = iStack_28 + 1) {
        context->esimap[cnt._2_2_] = 1 << ((byte)(ushort)cnt & 0x1f) | context->esimap[cnt._2_2_];
        cnt._0_2_ = (ushort)cnt + 1;
        if (0x1f < (ushort)cnt) {
          cnt._0_2_ = 0;
          cnt._2_2_ = cnt._2_2_ + 1;
        }
      }
      local_2d = context->esibuf[address];
    }
    else {
      local_2d = context->esibuf[address];
    }
  }
  return local_2d;
}

Assistant:

uint8 ecx_siigetbyte(ecx_contextt *context, uint16 slave, uint16 address)
{
   uint16 configadr, eadr;
   uint64 edat;
   uint16 mapw, mapb;
   int lp,cnt;
   uint8 retval;

   retval = 0xff;
   if (slave != context->esislave) /* not the same slave? */
   {
      memset(context->esimap, 0x00, EC_MAXEEPBITMAP); /* clear esibuf cache map */
      context->esislave = slave;
   }
   if (address < EC_MAXEEPBUF)
   {
      mapw = address >> 5;
      mapb = address - (mapw << 5);
      if (context->esimap[mapw] & (uint32)(1 << mapb))
      {
         /* byte is already in buffer */
         retval = context->esibuf[address];
      }
      else
      {
         /* byte is not in buffer, put it there */
         configadr = context->slavelist[slave].configadr;
         ecx_eeprom2master(context, slave); /* set eeprom control to master */
         eadr = address >> 1;
         edat = ecx_readeepromFP (context, configadr, eadr, EC_TIMEOUTEEP);
         /* 8 byte response */
         if (context->slavelist[slave].eep_8byte)
         {
            put_unaligned64(edat, &(context->esibuf[eadr << 1]));
            cnt = 8;
         }
         /* 4 byte response */
         else
         {
            put_unaligned32(edat, &(context->esibuf[eadr << 1]));
            cnt = 4;
         }
         /* find bitmap location */
         mapw = eadr >> 4;
         mapb = (eadr << 1) - (mapw << 5);
         for(lp = 0 ; lp < cnt ; lp++)
         {
            /* set bitmap for each byte that is read */
            context->esimap[mapw] |= (1 << mapb);
            mapb++;
            if (mapb > 31)
            {
               mapb = 0;
               mapw++;
            }
         }
         retval = context->esibuf[address];
      }
   }

   return retval;
}